

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::inst::MirFunction::display(MirFunction *this,ostream *o)

{
  bool bVar1;
  element_type *peVar2;
  ostream *poVar3;
  ostream *in_RSI;
  long in_RDI;
  const_iterator i_3;
  pair<const_unsigned_int,_mir::inst::Variable> *i_2;
  const_iterator __end3;
  const_iterator __begin3;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *__range3;
  iterator i_1;
  iterator i;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_> *params
  ;
  SharedTyPtr *return_ty;
  undefined4 in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  VarId *in_stack_ffffffffffffff20;
  ostream *in_stack_ffffffffffffff28;
  _Self local_a0;
  _Self local_98 [3];
  reference local_80;
  _Self local_78;
  _Self local_70;
  long local_68;
  shared_ptr<mir::types::Ty> *local_60;
  shared_ptr<mir::types::Ty> *local_58;
  shared_ptr<mir::types::Ty> *local_50;
  __normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
  local_48;
  shared_ptr<mir::types::Ty> *local_40;
  shared_ptr<mir::types::Ty> *local_38;
  shared_ptr<mir::types::Ty> *local_30;
  __normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
  local_28;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  *local_20;
  SharedTyPtr *local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  peVar2 = std::
           __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2be89d);
  local_18 = &peVar2->ret;
  peVar2 = std::
           __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2be8b7);
  local_20 = &peVar2->params;
  peVar2 = std::
           __shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2be8d1);
  if ((peVar2->is_extern & 1U) == 0) {
    poVar3 = std::operator<<(local_10,"fn ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 8));
    std::operator<<(poVar3,"(");
    local_48._M_current =
         (shared_ptr<mir::types::Ty> *)
         std::
         vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
         ::begin((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    while( true ) {
      local_50 = (shared_ptr<mir::types::Ty> *)
                 std::
                 vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                 ::end((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (!bVar1) break;
      local_58 = (shared_ptr<mir::types::Ty> *)
                 std::
                 vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                 ::begin((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (bVar1) {
        std::operator<<(local_10,", ");
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
      ::operator*(&local_48);
      std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffff20);
      prelude::operator<<((ostream *)in_stack_ffffffffffffff20,
                          (Displayable *)
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_60 = (shared_ptr<mir::types::Ty> *)
                 __gnu_cxx::
                 __normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                 ::operator++((__normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                               *)in_stack_ffffffffffffff28,
                              (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    }
    std::operator<<(local_10,") -> ");
    std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff20);
    poVar3 = prelude::operator<<((ostream *)in_stack_ffffffffffffff20,
                                 (Displayable *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    poVar3 = std::operator<<(poVar3," {");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_68 = in_RDI + 0x38;
    local_70._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
         ::begin((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_78._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
         ::end((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    while (bVar1 = std::operator!=(&local_70,&local_78), bVar1) {
      local_80 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::
                 operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>
                            *)in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff28 = std::operator<<(local_10,"\t");
      VarId::VarId(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      poVar3 = prelude::operator<<((ostream *)in_stack_ffffffffffffff20,
                                   (Displayable *)
                                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::operator<<(poVar3,": ");
      poVar3 = prelude::operator<<((ostream *)in_stack_ffffffffffffff20,
                                   (Displayable *)
                                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                 in_stack_ffffffffffffff20);
    }
    local_98[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    while( true ) {
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      bVar1 = std::operator!=(local_98,&local_a0);
      if (!bVar1) break;
      poVar3 = local_10;
      std::_Rb_tree_const_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)local_10);
      prelude::operator<<(poVar3,(Displayable *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::_Rb_tree_const_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                 in_stack_ffffffffffffff28,(int)((ulong)poVar3 >> 0x20));
    }
    poVar3 = std::operator<<(local_10,"}");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<(local_10,"extern fn ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 8));
    std::operator<<(poVar3,"(");
    local_28._M_current =
         (shared_ptr<mir::types::Ty> *)
         std::
         vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
         ::begin((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    while( true ) {
      local_30 = (shared_ptr<mir::types::Ty> *)
                 std::
                 vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                 ::end((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (!bVar1) break;
      local_38 = (shared_ptr<mir::types::Ty> *)
                 std::
                 vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                 ::begin((vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                          *)in_stack_ffffffffffffff20,
                         (__normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      if (bVar1) {
        std::operator<<(local_10,", ");
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
      ::operator*(&local_28);
      std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffff20);
      prelude::operator<<((ostream *)in_stack_ffffffffffffff20,
                          (Displayable *)
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_40 = (shared_ptr<mir::types::Ty> *)
                 __gnu_cxx::
                 __normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                 ::operator++((__normal_iterator<std::shared_ptr<mir::types::Ty>_*,_std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>_>
                               *)in_stack_ffffffffffffff28,
                              (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    }
    std::operator<<(local_10,") -> ");
    std::__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff20);
    poVar3 = prelude::operator<<((ostream *)in_stack_ffffffffffffff20,
                                 (Displayable *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    poVar3 = std::operator<<(poVar3,";");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void MirFunction::display(std::ostream& o) const {
  auto& return_ty = type->ret;
  auto& params = type->params;
  if (type->is_extern) {
    o << "extern fn " << name << "(";
    for (auto i = params.begin(); i != params.end(); i++) {
      if (i != params.begin()) o << ", ";
      o << **i;
    }
    o << ") -> " << *return_ty << ";" << std::endl;
  } else {
    o << "fn " << name << "(";
    for (auto i = params.begin(); i != params.end(); i++) {
      if (i != params.begin()) o << ", ";
      o << **i;
    }
    o << ") -> " << *return_ty << " {" << std::endl;
    for (auto& i : variables) {
      o << "\t" << VarId(i.first) << ": " << i.second << std::endl;
      ;
    }
    for (auto i = basic_blks.begin(); i != basic_blks.end(); i++) {
      o << i->second;
    }
    o << "}" << std::endl;
  }
}